

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O3

void writeKeys<unsigned_short>
               (string *str,vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,
               string *key_type,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  ushort uVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  long *plVar8;
  int *piVar9;
  char cVar10;
  ulong uVar11;
  long lVar12;
  string *psVar13;
  uint __len;
  string __str_1;
  string __str;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string *local_a8;
  ulong *local_a0;
  uint local_98;
  undefined4 uStack_94;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_60;
  int *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8 = str;
  local_60 = keys;
  std::operator+(&local_50,"    static constexpr std::array<",key_type);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_70 = *puVar6;
    lStack_68 = plVar4[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar6;
    local_80 = (ulong *)*plVar4;
  }
  local_78 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar11 = n + 1;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar7 = uVar11;
    cVar3 = '\x04';
    do {
      cVar10 = cVar3;
      if (uVar7 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0010c254;
      }
      if (uVar7 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0010c254;
      }
      if (uVar7 < 10000) goto LAB_0010c254;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_0010c254:
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a0,local_98,uVar11);
  uVar11 = CONCAT44(uStack_94,local_98) + local_78;
  uVar7 = 0xf;
  if (local_80 != &local_70) {
    uVar7 = local_70;
  }
  if (uVar7 < uVar11) {
    uVar7 = 0xf;
    if (local_a0 != local_90) {
      uVar7 = local_90[0];
    }
    if (uVar11 <= uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_80);
      goto LAB_0010c2d6;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0);
LAB_0010c2d6:
  local_e8 = &local_d8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_d8 = *plVar4;
    uStack_d0 = puVar5[3];
  }
  else {
    local_d8 = *plVar4;
    local_e8 = (long *)*puVar5;
  }
  local_e0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
  local_c8 = &local_b8;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_b8 = *plVar8;
    lStack_b0 = plVar4[3];
  }
  else {
    local_b8 = *plVar8;
    local_c8 = (long *)*plVar4;
  }
  local_c0 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_c8);
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  psVar13 = local_a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  piVar9 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_58 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (piVar9 != local_58) {
    uVar11 = 0;
    lVar12 = 0;
    do {
      if ((lVar12 != 0) && (-lVar12 == (uVar11 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)psVar13);
      }
      if ((long)*piVar9 == -1) {
        std::__cxx11::string::append((char *)psVar13);
      }
      else {
        uVar1 = (local_60->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                _M_impl.super__Vector_impl_data._M_start[*piVar9];
        __len = 1;
        if (((9 < uVar1) && (__len = 2, 99 < uVar1)) && (__len = 3, 999 < uVar1)) {
          __len = 5 - (uVar1 < 10000);
        }
        local_e8 = &local_d8;
        std::__cxx11::string::_M_construct((ulong)&local_e8,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e8,__len,(uint)uVar1);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
        psVar13 = local_a8;
        plVar8 = plVar4 + 2;
        if ((long *)*plVar4 == plVar8) {
          local_b8 = *plVar8;
          lStack_b0 = plVar4[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar8;
          local_c8 = (long *)*plVar4;
        }
        local_c0 = plVar4[1];
        *plVar4 = (long)plVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_c8);
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_e8 != &local_d8) {
          operator_delete(local_e8,local_d8 + 1);
        }
      }
      piVar9 = piVar9 + 1;
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + -1;
    } while (piVar9 != local_58);
  }
  std::__cxx11::string::append((char *)psVar13);
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<KeyType>& keys,
               std::string key_type,
               const std::vector<int>& mapping,
               size_t n){
    str += "    static constexpr std::array<" + key_type + ", " + std::to_string(n+1) + "> keys {\n        ";

    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row==0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else    str += std::to_string(keys[val]) + ",";
    }
    str += "\n    };\n";
}